

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O2

TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *
__thiscall
BurstSimple<unsigned_short>::operator()
          (BurstSimple<unsigned_short> *this,
          vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket,size_t depth)

{
  uchar *ptr;
  uint16_t uVar1;
  TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *this_00
  ;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *pvVar2;
  ulong uVar3;
  long lVar4;
  uint j;
  long lVar5;
  uchar **__x;
  ulong uVar6;
  array<unsigned_short,_64UL> cache;
  array<unsigned_char_*,_64UL> strings;
  
  this_00 = (TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
             *)operator_new(0x18);
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = (ulong)((long)(bucket->
                        super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(bucket->
                       super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                       _M_impl.super__Vector_impl_data._M_start) >> 3;
  lVar4 = 0;
  uVar6 = 0;
  do {
    if (((uint)uVar3 & 0xffffffc0) <= uVar6) {
      while( true ) {
        if ((uVar3 & 0xffffffff) <= uVar6) {
          return this_00;
        }
        strings._M_elems[0] =
             (bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl
             .super__Vector_impl_data._M_start[uVar6];
        uVar1 = get_char<unsigned_short>(strings._M_elems[0],depth);
        pvVar2 = TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
                 ::get_bucket(this_00,(uint)uVar1);
        if (pvVar2 == (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)0x0) break;
        std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
                  (pvVar2,strings._M_elems);
        uVar6 = uVar6 + 1;
      }
      __assert_fail("sub_bucket",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                    ,0x80,
                    "TrieNode<CharT, BucketT> *BurstSimple<unsigned short>::operator()(const BucketT &, size_t) const [CharT = unsigned short, BucketT = std::vector<unsigned char *>]"
                   );
    }
    for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 1) {
      ptr = *(uchar **)
             ((long)(bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                    _M_impl.super__Vector_impl_data._M_start + lVar5 * 8 + lVar4);
      strings._M_elems[lVar5] = ptr;
      uVar1 = get_char<unsigned_short>(ptr,depth);
      cache._M_elems[lVar5] = uVar1;
    }
    __x = strings._M_elems;
    for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 1) {
      pvVar2 = TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
               ::get_bucket(this_00,(uint)cache._M_elems[lVar5]);
      if (pvVar2 == (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)0x0) {
        __assert_fail("sub_bucket",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0x78,
                      "TrieNode<CharT, BucketT> *BurstSimple<unsigned short>::operator()(const BucketT &, size_t) const [CharT = unsigned short, BucketT = std::vector<unsigned char *>]"
                     );
      }
      std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back(pvVar2,__x);
      __x = __x + 1;
    }
    uVar6 = uVar6 + 0x40;
    lVar4 = lVar4 + 0x200;
  } while( true );
}

Assistant:

TrieNode<CharT, BucketT>*
	operator()(const BucketT& bucket, size_t depth) const
	{
		TrieNode<CharT, BucketT>* new_node = new TrieNode<CharT, BucketT>;
		const unsigned bucket_size = bucket.size();
		// Use a small cache to reduce memory stalls. Also cache the
		// string pointers, in case the indexing operation of the
		// container is expensive.
		unsigned i=0;
		for (; i < bucket_size-bucket_size%64; i+=64) {
			std::array<CharT, 64> cache;
			std::array<unsigned char*, 64> strings;
			for (unsigned j=0; j < 64; ++j) {
				strings[j] = bucket[i+j];
				cache[j] = get_char<CharT>(strings[j], depth);
			}
			for (unsigned j=0; j < 64; ++j) {
				const CharT ch = cache[j];
				BucketT* sub_bucket = new_node->get_bucket(ch);
				assert(sub_bucket);
				sub_bucket->push_back(strings[j]);
			}
		}
		for (; i < bucket_size; ++i) {
			unsigned char* ptr = bucket[i];
			const CharT ch = get_char<CharT>(ptr, depth);
			BucketT* sub_bucket = new_node->get_bucket(ch);
			assert(sub_bucket);
			sub_bucket->push_back(ptr);
		}
		return new_node;
	}